

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

CURLcode Curl_resolver_is_resolved(connectdata *conn,Curl_dns_entry **entry)

{
  _Bool _Var1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  timediff_t tVar7;
  long lVar8;
  char *pcVar9;
  curltime newer;
  curltime older;
  curltime cVar10;
  
  pCVar2 = conn->data;
  pvVar3 = (conn->async).os_specific;
  *entry = (Curl_dns_entry *)0x0;
  if (pvVar3 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  iVar6 = *(int *)((long)pvVar3 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  if (iVar6 != 0) {
    pvVar3 = (conn->async).os_specific;
    Curl_addrinfo_callback
              (conn,*(int *)((long)pvVar3 + 0x34),*(Curl_addrinfo **)((long)pvVar3 + 0x38));
    *(undefined8 *)((long)pvVar3 + 0x38) = 0;
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *entry = (conn->async).dns;
      return CURLE_OK;
    }
    _Var1 = (conn->bits).httpproxy;
    pcVar9 = "host";
    if (_Var1 != false) {
      pcVar9 = "proxy";
    }
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar9,(conn->async).hostname);
    destroy_async_data(&conn->async);
    return CURLE_COULDNT_RESOLVE_HOST - _Var1;
  }
  cVar10 = Curl_now();
  uVar4 = (pCVar2->progress).t_startsingle.tv_sec;
  uVar5 = (pCVar2->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar10._0_12_,0);
  newer.tv_usec = SUB124(cVar10._0_12_,8);
  older._12_4_ = 0;
  tVar7 = Curl_timediff(newer,older);
  lVar8 = 0;
  if (0 < tVar7) {
    lVar8 = tVar7;
  }
  if (*(int *)((long)pvVar3 + 8) == 0) {
    iVar6 = 1;
  }
  else {
    if (lVar8 < *(long *)((long)pvVar3 + 0x10)) goto LAB_001392cd;
    iVar6 = *(int *)((long)pvVar3 + 8) * 2;
  }
  *(int *)((long)pvVar3 + 8) = iVar6;
LAB_001392cd:
  if (0xfa < *(uint *)((long)pvVar3 + 8)) {
    *(undefined4 *)((long)pvVar3 + 8) = 0xfa;
  }
  *(ulong *)((long)pvVar3 + 0x10) = lVar8 + (ulong)*(uint *)((long)pvVar3 + 8);
  Curl_expire(conn->data,(ulong)*(uint *)((long)pvVar3 + 8),EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct Curl_easy *data = conn->data;
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  int done = 0;

  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(conn);

    if(!conn->async.dns) {
      CURLcode result = resolver_error(conn);
      destroy_async_data(&conn->async);
      return result;
    }
    destroy_async_data(&conn->async);
    *entry = conn->async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    timediff_t elapsed = Curl_timediff(Curl_now(),
                                       data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(conn->data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}